

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Column_zp_settings *this;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false>_>
  m;
  shared_count sStack_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined **local_2b8;
  undefined1 local_2b0;
  undefined8 *local_2a8;
  char **local_2a0;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_298;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 local_160 [88];
  __buckets_ptr local_108;
  ulong local_100;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  local_160._0_8_ = this;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>>
              *)(local_160 + 8),&local_298,this);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x26d);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_100;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar5,0);
  if (local_108[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_108[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var13 = p_Var2 + 5;
        goto LAB_00166528;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_100 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var13[2]._M_nxt != 1) {
LAB_00166528:
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 5) break;
  }
  sStack_2d0.pi_ = (sp_counted_base *)0x0;
  local_2c8 = "!m.is_zero_entry(3, 1)";
  local_2c0 = "";
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_001fb150;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_2a0 = &local_2c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d0);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x26e);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_100;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_108[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_108[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2d0.pi_ = (sp_counted_base *)0x0;
        local_2c8 = "!m.is_zero_column(3)";
        local_2c0 = "";
        local_2b0 = 0;
        local_2b8 = &PTR__lazy_ostream_001fb150;
        local_2a8 = &boost::unit_test::lazy_ostream::inst;
        local_1c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1b8 = "";
        local_2a0 = &local_2c8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2d0);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_100;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
        if (local_108[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_00166c65;
        p_Var2 = local_108[uVar14 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0016670e;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_100 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var13[2]._M_nxt != 1) {
LAB_0016673c:
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 5) goto LAB_0016676b;
  }
  p_Var3 = p_Var13->_M_nxt;
  p_Var4 = p_Var13[1]._M_nxt;
  p_Var4->_M_nxt = p_Var3;
  p_Var3[1]._M_nxt = p_Var4;
  p_Var13->_M_nxt = (_Hash_node_base *)0x0;
  p_Var13[1]._M_nxt = (_Hash_node_base *)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false>_>_>_>
             *)p_Var2[4]._M_nxt,(pointer)(p_Var13 + -1));
LAB_0016676b:
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x270);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_100;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
  if (local_108[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_108[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var13 = p_Var2 + 5;
        goto LAB_001667fb;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_100 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var13[2]._M_nxt != 1) {
LAB_001667fb:
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 5) break;
  }
  sStack_2d0.pi_ = (sp_counted_base *)0x0;
  local_2c8 = "m.is_zero_entry(3, 1)";
  local_2c0 = "";
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_001fb150;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_2a0 = &local_2c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d0);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x271);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_100;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_108[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_108[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2d0.pi_ = (sp_counted_base *)0x0;
        local_2c8 = "!m.is_zero_column(3)";
        local_2c0 = "";
        local_2b0 = 0;
        local_2b8 = &PTR__lazy_ostream_001fb150;
        local_2a8 = &boost::unit_test::lazy_ostream::inst;
        local_220 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_218 = "";
        local_2a0 = &local_2c8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2d0);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_100;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
        if (local_108[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_00166c65;
        p_Var2 = local_108[uVar14 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001669dd;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_100 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_100 == uVar14))) {
joined_r0x0016670e:
    if (uVar1 == 3) {
      p_Var13 = p_Var2 + 5;
      goto LAB_0016673c;
    }
  }
LAB_00166c65:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x001669dd:
  if (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_100 != uVar14)) goto LAB_00166c65;
    goto joined_r0x001669dd;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var2 + 5),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false>_>_>
              *)(p_Var2 + 2));
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x273);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_100;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (local_108[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_00166ca1;
  p_Var2 = local_108[uVar14 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_100 != uVar14)) {
LAB_00166ca1:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var13 = p_Var2 + 5;
  do {
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 5) break;
  } while (*(int *)&p_Var13[2]._M_nxt != 1);
  sStack_2d0.pi_ = (sp_counted_base *)0x0;
  local_2c8 = "m.is_zero_entry(3, 1)";
  local_2c0 = "";
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_001fb150;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_2a0 = &local_2c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d0);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x274);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_100;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
  if (local_108[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_108[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2d0.pi_ = (sp_counted_base *)0x0;
        local_2c8 = "m.is_zero_column(3)";
        local_2c0 = "";
        local_2b0 = 0;
        local_2b8 = &PTR__lazy_ostream_001fb150;
        local_2a8 = &boost::unit_test::lazy_ostream::inst;
        local_280 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_278 = "";
        local_2a0 = &local_2c8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2d0);
        Gudhi::persistence_matrix::
        Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false>_>
        ::~Matrix((Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false>_>
                   *)local_160);
        std::
        vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&local_298);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_100 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}